

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

Node __thiscall mocker::detail::InterferenceGraph::getAlias(InterferenceGraph *this,Node *n)

{
  bool bVar1;
  shared_ptr<mocker::nasm::Register> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Node NVar3;
  Node *n_local;
  InterferenceGraph *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                    ((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      *)(n + 0x1b),in_RDX);
  if (bVar1) {
    std::
    unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
    ::at((unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
          *)(n + 0x22),in_RDX);
    NVar3 = getAlias(this,n);
    _Var2 = NVar3.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  }
  else {
    std::shared_ptr<mocker::nasm::Register>::shared_ptr
              ((shared_ptr<mocker::nasm::Register> *)this,in_RDX);
    _Var2._M_pi = extraout_RDX;
  }
  NVar3.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  NVar3.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar3.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node InterferenceGraph::getAlias(const Node &n) const {
  if (isIn(coalesced, n))
    return getAlias(alias.at(n));
  return n;
}